

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O1

size_t __thiscall
ProblemFireFighting::NumberOfContainedStartPositions
          (ProblemFireFighting *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *state)

{
  ulong uVar1;
  pointer puVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  
  if (this->_m_includePositions == true) {
    uVar1 = *(ulong *)&(this->super_DecPOMDPDiscrete).field_0x228;
    if ((uVar1 & 0xffffffff) < this->_m_nrStateFeatures) {
      puVar2 = (state->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = (uint)uVar1;
      sVar3 = 0;
      uVar4 = uVar1 & 0xffffffff;
      do {
        uVar5 = uVar5 + 1;
        if ((ulong)((long)(state->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar4) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        sVar3 = sVar3 + (uVar1 == puVar2[uVar4]);
        uVar4 = (ulong)uVar5;
      } while ((ulong)uVar5 < this->_m_nrStateFeatures);
      return sVar3;
    }
  }
  return 0;
}

Assistant:

size_t ProblemFireFighting::
NumberOfContainedStartPositions(const vector<Index>& state) 
    const
{
    if(!_m_includePositions)
        return(0);

    size_t nrSPs = 0;
    //loop over the position features:
    for(Index i = _m_nrHouses; i < _m_nrStateFeatures; i++)
        if(state.at(i) == _m_nrHouses) //the 'start' postion index = nrHouses
            nrSPs++;
    return nrSPs;
    
}